

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssse3_gemm.h
# Opt level: O3

void intgemm::SSSE3::Kernels8::QuantizeU(float *input,uint8_t *output,float quant_mult,Index size)

{
  float *pfVar1;
  uint8_t *puVar2;
  undefined1 auVar3 [16];
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  
  auVar3 = _DAT_0010a0a0;
  if (size != 0) {
    lVar4 = 0;
    do {
      pfVar1 = input + lVar4;
      auVar5._0_4_ = (int)(*pfVar1 * quant_mult);
      auVar5._4_4_ = (int)(pfVar1[1] * quant_mult);
      auVar5._8_4_ = (int)(pfVar1[2] * quant_mult);
      auVar5._12_4_ = (int)(pfVar1[3] * quant_mult);
      auVar6._0_4_ = (int)(pfVar1[4] * quant_mult);
      auVar6._4_4_ = (int)(pfVar1[5] * quant_mult);
      auVar6._8_4_ = (int)(pfVar1[6] * quant_mult);
      auVar6._12_4_ = (int)(pfVar1[7] * quant_mult);
      auVar5 = packssdw(auVar5,auVar6);
      auVar7._0_4_ = (int)(pfVar1[8] * quant_mult);
      auVar7._4_4_ = (int)(pfVar1[9] * quant_mult);
      auVar7._8_4_ = (int)(pfVar1[10] * quant_mult);
      auVar7._12_4_ = (int)(pfVar1[0xb] * quant_mult);
      auVar8._4_4_ = (int)(pfVar1[0xd] * quant_mult);
      auVar8._0_4_ = (int)(pfVar1[0xc] * quant_mult);
      auVar8._8_4_ = (int)(pfVar1[0xe] * quant_mult);
      auVar8._12_4_ = (int)(pfVar1[0xf] * quant_mult);
      auVar8 = packssdw(auVar7,auVar8);
      auVar8 = packsswb(auVar5,auVar8);
      auVar9[0] = -(auVar3[0] < auVar8[0]);
      auVar9[1] = -(auVar3[1] < auVar8[1]);
      auVar9[2] = -(auVar3[2] < auVar8[2]);
      auVar9[3] = -(auVar3[3] < auVar8[3]);
      auVar9[4] = -(auVar3[4] < auVar8[4]);
      auVar9[5] = -(auVar3[5] < auVar8[5]);
      auVar9[6] = -(auVar3[6] < auVar8[6]);
      auVar9[7] = -(auVar3[7] < auVar8[7]);
      auVar9[8] = -(auVar3[8] < auVar8[8]);
      auVar9[9] = -(auVar3[9] < auVar8[9]);
      auVar9[10] = -(auVar3[10] < auVar8[10]);
      auVar9[0xb] = -(auVar3[0xb] < auVar8[0xb]);
      auVar9[0xc] = -(auVar3[0xc] < auVar8[0xc]);
      auVar9[0xd] = -(auVar3[0xd] < auVar8[0xd]);
      auVar9[0xe] = -(auVar3[0xe] < auVar8[0xe]);
      auVar9[0xf] = -(auVar3[0xf] < auVar8[0xf]);
      auVar8 = ~auVar9 & auVar3 | auVar8 & auVar9;
      puVar2 = output + lVar4;
      *puVar2 = auVar8[0] + '\x7f';
      puVar2[1] = auVar8[1] + '\x7f';
      puVar2[2] = auVar8[2] + '\x7f';
      puVar2[3] = auVar8[3] + '\x7f';
      puVar2[4] = auVar8[4] + '\x7f';
      puVar2[5] = auVar8[5] + '\x7f';
      puVar2[6] = auVar8[6] + '\x7f';
      puVar2[7] = auVar8[7] + '\x7f';
      puVar2[8] = auVar8[8] + '\x7f';
      puVar2[9] = auVar8[9] + '\x7f';
      puVar2[10] = auVar8[10] + '\x7f';
      puVar2[0xb] = auVar8[0xb] + '\x7f';
      puVar2[0xc] = auVar8[0xc] + '\x7f';
      puVar2[0xd] = auVar8[0xd] + '\x7f';
      puVar2[0xe] = auVar8[0xe] + '\x7f';
      puVar2[0xf] = auVar8[0xf] + '\x7f';
      lVar4 = lVar4 + 0x10;
    } while (pfVar1 + 0x10 != input + size);
  }
  return;
}

Assistant:

INTGEMM_SSSE3 static void QuantizeU(const float *input, uint8_t *output, float quant_mult, Index size) {
    assert(size % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(input) % 16 == 0);
    assert(reinterpret_cast<uintptr_t>(output) % 16 == 0);
    FRegister q = set1_ps<FRegister>(quant_mult);
    const float *end = input + size;
    for (; input != end; input += 16, output += 16) {
      *reinterpret_cast<__m128i*>(output) = QuantizeTile8::ConsecutiveU(q, input);
    }
  }